

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_type_and_value
          (basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
           *this,json_visitor *visitor,error_code *ec)

{
  type_conflict2 tVar1;
  uint8_t b;
  
  tVar1 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::read<std::random_access_iterator_tag>(&this->source_,&b,1);
  if (tVar1 == 0) {
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
  }
  else {
    read_value(this,visitor,b,ec);
  }
  return;
}

Assistant:

void read_type_and_value(json_visitor& visitor, std::error_code& ec)
    {
        if (source_.is_error())
        {
            ec = ubjson_errc::source_error;
            more_ = false;
            return;
        }   

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        read_value(visitor, b, ec);
    }